

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Locate_region(int g_a,int *lo,int *hi,int *map,int *procs)

{
  Integer IVar1;
  long lVar2;
  long *plVar3;
  Integer *map_00;
  Integer *proclist;
  logical lVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  Integer *pIVar8;
  Integer *pIVar9;
  long lVar10;
  Integer np_guess;
  Integer np_actual;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  long local_b8;
  long local_b0;
  Integer local_a8 [7];
  long lStack_70;
  Integer local_68 [7];
  
  lVar7 = (long)g_a;
  IVar1 = pnga_ndim(lVar7);
  lVar2 = 0;
  lVar5 = 0;
  if (0 < IVar1) {
    lVar5 = IVar1;
  }
  plVar3 = &lStack_70 + IVar1;
  for (; lVar5 != lVar2; lVar2 = lVar2 + 1) {
    *plVar3 = (long)lo[lVar2] + 1;
    plVar3 = plVar3 + -1;
  }
  plVar3 = local_a8 + IVar1 + -1;
  for (lVar2 = 0; lVar5 != lVar2; lVar2 = lVar2 + 1) {
    *plVar3 = (long)hi[lVar2] + 1;
    plVar3 = plVar3 + -1;
  }
  pnga_locate_nnodes(lVar7,local_68,local_a8,&local_b8);
  lVar2 = local_b8;
  map_00 = (Integer *)malloc((long)((int)local_b8 * (int)IVar1 * 0x10));
  if (map == (int *)0x0) {
    GA_Error("NGA_Locate_region: unable to allocate memory",g_a);
    lVar2 = local_b8;
  }
  proclist = (Integer *)malloc(lVar2 << 3);
  lVar4 = pnga_locate_region(lVar7,local_68,local_a8,map_00,proclist,&local_b0);
  if (local_b8 == local_b0) {
    if (lVar4 == 0) {
      free(map_00);
      free(proclist);
      local_b8 = 0;
    }
    else {
      lVar7 = 0;
      lVar2 = 0;
      if (0 < local_b8) {
        lVar2 = local_b8;
      }
      for (; lVar2 != lVar7; lVar7 = lVar7 + 1) {
        procs[lVar7] = (int)proclist[lVar7];
      }
      lVar7 = 0;
      lVar2 = local_b8 * 2;
      if (local_b8 * 2 < 1) {
        lVar2 = lVar7;
      }
      piVar6 = map + IVar1 + -1;
      pIVar8 = map_00;
      for (; lVar7 != lVar2; lVar7 = lVar7 + 1) {
        pIVar9 = pIVar8;
        for (lVar10 = 0; -lVar10 != lVar5; lVar10 = lVar10 + -1) {
          piVar6[lVar10] = (int)*pIVar9 + -1;
          pIVar9 = pIVar9 + 1;
        }
        pIVar8 = pIVar8 + IVar1;
        piVar6 = piVar6 + IVar1;
      }
      free(map_00);
      free(proclist);
    }
    return (int)local_b8;
  }
  __assert_fail("np_guess == np_actual",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/src/capi.c"
                ,0xa74,"int NGA_Locate_region(int, int *, int *, int *, int *)");
}

Assistant:

int NGA_Locate_region(int g_a,int lo[],int hi[],int map[],int procs[])
{
     logical st;
     Integer a=(Integer)g_a, np_guess, np_actual;
     Integer ndim = wnga_ndim(a);
     Integer *tmap;
     int i;
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
     Integer *_ga_map_capi;
     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);
     st = wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np_guess);
     tmap = (Integer *)malloc( (int)(np_guess*2*ndim *sizeof(Integer)));
     if(!map)GA_Error("NGA_Locate_region: unable to allocate memory",g_a);
     _ga_map_capi = (Integer*)malloc(np_guess*sizeof(Integer));

     st = wnga_locate_region(a,_ga_lo, _ga_hi, tmap, _ga_map_capi, &np_actual);
     assert(np_guess == np_actual);
     if(st==FALSE){
       free(tmap);
       free(_ga_map_capi);
       return 0;
     }

     COPY(int,_ga_map_capi,procs, np_actual);

        /* might have to swap lo/hi when copying */

     for(i=0; i< np_actual*2; i++){
        Integer *ptmap = tmap+i*ndim;
        int *pmap = map +i*ndim;
        COPYINDEX_F2C(ptmap, pmap, ndim);  
     }
     free(tmap);
     free(_ga_map_capi);
     return (int)np_actual;
}